

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

Var Js::CrossSite::DefaultThunk(RecyclableObject *callable,CallInfo callInfo,...)

{
  code *pcVar1;
  FunctionInfo *entryPoint_00;
  bool bVar2;
  TypeId TVar3;
  int n;
  BOOL BVar4;
  JavascriptFunction *this;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  Var *values;
  ScriptContext *this_00;
  ThreadContext *this_01;
  HostScriptContext *requestHostScriptContext;
  FunctionProxy *this_02;
  FunctionBody *this_03;
  ScriptFunction *this_04;
  ProxyEntryPointInfo *pPVar7;
  Var pvVar8;
  Arguments local_70;
  FunctionInfo *local_60;
  FunctionInfo *funcInfo;
  JavascriptMethod entryPoint;
  undefined1 local_48 [8];
  Arguments args;
  Var *_argsVarArray;
  JavascriptFunction *function;
  RecyclableObject *callable_local;
  CallInfo callInfo_local;
  
  this = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(callable);
  TVar3 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  if (TVar3 != TypeIds_Function) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x19e,"(function->GetTypeId() == TypeIds_Function)",
                                "function->GetTypeId() == TypeIds_Function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)this);
  if (p_Var6 != DefaultThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x19f,"(function->GetEntryPoint() == CrossSite::DefaultThunk)",
                                "function->GetEntryPoint() == CrossSite::DefaultThunk");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1a0,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  entryPoint = (JavascriptMethod)callInfo;
  Arguments::Arguments((Arguments *)local_48,callInfo,values);
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar4 = RecyclableObject::IsExternal((RecyclableObject *)this);
  this_01 = ThreadContext::GetContextForCurrentThread();
  requestHostScriptContext = ThreadContext::GetPreviousHostScriptContext(this_01);
  ScriptContext::VerifyAliveWithHostContext
            (this_00,(uint)((BVar4 != 0 ^ 0xffU) & 1),requestHostScriptContext);
  local_60 = JavascriptFunction::GetFunctionInfo(this);
  BVar4 = FunctionInfo::HasBody(local_60);
  if (BVar4 == 0) {
    funcInfo = (FunctionInfo *)FunctionInfo::GetOriginalEntryPoint(local_60);
  }
  else {
    this_02 = FunctionInfo::GetFunctionProxy(local_60);
    bVar2 = FunctionProxy::IsFunctionBody(this_02);
    if (bVar2) {
      this_03 = FunctionInfo::GetFunctionBody(local_60);
      bVar2 = FunctionBody::GetIsAsmJsFunction(this_03);
      if (bVar2) {
        funcInfo = (FunctionInfo *)AsmJsExternalEntryPoint;
        goto LAB_00a0c9ea;
      }
    }
    this_04 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(this);
    pPVar7 = ScriptFunction::GetEntryPointInfo(this_04);
    funcInfo = (FunctionInfo *)pPVar7->jsMethod;
  }
LAB_00a0c9ea:
  entryPoint_00 = funcInfo;
  Arguments::Arguments(&local_70,(Arguments *)local_48);
  pvVar8 = CommonThunk((RecyclableObject *)this,(JavascriptMethod)entryPoint_00,&local_70);
  return pvVar8;
}

Assistant:

Var CrossSite::DefaultThunk(RecyclableObject* callable, CallInfo callInfo, ...)
    {
        JavascriptFunction* function = VarTo<JavascriptFunction>(callable);
        Assert(function->GetTypeId() == TypeIds_Function);
        Assert(function->GetEntryPoint() == CrossSite::DefaultThunk);
        RUNTIME_ARGUMENTS(args, callInfo);

        // It is not safe to access the function body if the script context is not alive.
        function->GetScriptContext()->VerifyAliveWithHostContext(!function->IsExternal(),
            ThreadContext::GetContextForCurrentThread()->GetPreviousHostScriptContext());

        JavascriptMethod entryPoint;
        FunctionInfo *funcInfo = function->GetFunctionInfo();

        TTD_XSITE_LOG(callable->GetScriptContext(), "DefaultOrProfileThunk", callable);

        if (funcInfo->HasBody())
        {
#ifdef ASMJS_PLAT
            if (funcInfo->GetFunctionProxy()->IsFunctionBody() &&
                funcInfo->GetFunctionBody()->GetIsAsmJsFunction())
            {
                entryPoint = Js::AsmJsExternalEntryPoint;
            }
            else
#endif
            {
                entryPoint = VarTo<ScriptFunction>(function)->GetEntryPointInfo()->jsMethod;
            }
        }
        else
        {
            entryPoint = funcInfo->GetOriginalEntryPoint();
        }
        return CommonThunk(function, entryPoint, args);
    }